

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doge.cpp
# Opt level: O0

int main(void)

{
  cake_iterator<false> __first1;
  cake_iterator<false> __last1;
  cake_iterator<false> __first2;
  bool bVar1;
  ostream *poVar2;
  SLNode<int> *in_stack_ffffffffffffeb40;
  iterator local_14a8;
  iterator local_1490;
  SLNode<int> *local_1478 [2];
  SLNode<int> *local_1468;
  SLNode<int> *local_1460 [2];
  SLNode<int> *local_1450;
  iterator local_1448;
  int local_1430;
  int i;
  undefined1 local_1420 [8];
  skiplist<int,_std::less<int>_> s2;
  skiplist<int,_std::less<int>_> s1;
  
  skiplist<int,_std::less<int>_>::skiplist((skiplist<int,_std::less<int>_> *)&s2.field_0xa00);
  skiplist<int,_std::less<int>_>::skiplist((skiplist<int,_std::less<int>_> *)local_1420);
  for (local_1430 = 0; local_1430 < 10; local_1430 = local_1430 + 1) {
    skiplist<int,_std::less<int>_>::insert
              ((skiplist<int,_std::less<int>_> *)&s2.field_0xa00,local_1430);
    skiplist<int,_std::less<int>_>::insert((skiplist<int,_std::less<int>_> *)local_1420,local_1430);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::boolalpha);
  std::begin<skiplist<int,std::less<int>>>
            (&local_1448,(skiplist<int,_std::less<int>_> *)&s2.field_0xa00);
  std::end<skiplist<int,std::less<int>>>
            ((iterator *)local_1460,(skiplist<int,_std::less<int>_> *)&s2.field_0xa00);
  std::begin<skiplist<int,std::less<int>>>
            ((iterator *)local_1478,(skiplist<int,_std::less<int>_> *)local_1420);
  __first1._8_8_ = local_1448.node;
  __first1._0_8_ = local_1448._8_8_;
  __first1.node = local_1460[0];
  __last1._8_8_ = local_1450;
  __last1._0_8_ = local_1460[1];
  __last1.node = local_1478[0];
  __first2._8_8_ = local_1468;
  __first2._0_8_ = local_1478[1];
  __first2.node = in_stack_ffffffffffffeb40;
  bVar1 = std::
          equal<skiplist<int,std::less<int>>::cake_iterator<false>,skiplist<int,std::less<int>>::cake_iterator<false>>
                    (__first1,__last1,__first2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar1);
  std::operator<<(poVar2,"\n");
  std::begin<skiplist<int,std::less<int>>>
            (&local_1490,(skiplist<int,_std::less<int>_> *)&s2.field_0xa00);
  std::end<skiplist<int,std::less<int>>>
            (&local_14a8,(skiplist<int,_std::less<int>_> *)&s2.field_0xa00);
  std::for_each<skiplist<int,std::less<int>>::cake_iterator<false>,main::__0>();
  skiplist<int,_std::less<int>_>::~skiplist((skiplist<int,_std::less<int>_> *)local_1420);
  skiplist<int,_std::less<int>_>::~skiplist((skiplist<int,_std::less<int>_> *)&s2.field_0xa00);
  return 0;
}

Assistant:

int main() {
	skiplist<int> s1;
	skiplist<int> s2;

	for(int i = 0; i < 10; ++i) {
		s1.insert(i);
		s2.insert(i);
	}

	std::cout << std::boolalpha;
	std::cout << std::equal(begin(s1), end(s1), begin(s2)) << "\n";

	// for_each
	std::for_each(begin(s1), end(s1), [](int e) { std::cout << e << "\t"; });
}